

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjRemoveBufInv(Acb_Ntk_t *p,int iObj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word wVar5;
  word wVar6;
  int iFanout_1;
  int iFanin_1;
  word uTruthF;
  int iObjIndex;
  int iFanin;
  word uTruth;
  int iFanout;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  wVar5 = Acb_ObjTruth(p,iObj);
  iVar2 = Acb_ObjIsCio(p,iObj);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xe0,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  iVar2 = Acb_ObjFaninNum(p,iObj);
  if (iVar2 != 1) {
    __assert_fail("Acb_ObjFaninNum(p, iObj) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xe1,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  if ((wVar5 != s_Truths6[0]) && ((wVar5 ^ 0xffffffffffffffff) != s_Truths6[0])) {
    __assert_fail("uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xe2,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  while (iVar2 = Acb_ObjFindNodeFanout(p,iObj), -1 < iVar2) {
    iVar3 = Acb_ObjFanin(p,iObj,0);
    iVar4 = Acb_ObjWhatFanin(p,iVar2,iObj);
    Acb_ObjPatchFanin(p,iVar2,iObj,iVar3);
    if ((wVar5 & 1) != 0) {
      wVar6 = Acb_ObjTruth(p,iVar2);
      wVar6 = Abc_Tt6Flip(wVar6,iVar4);
      Vec_WrdWriteEntry(&p->vObjTruth,iVar2,wVar6);
    }
    Acb_ObjRemoveDupFanins(p,iVar2);
  }
  while( true ) {
    bVar1 = false;
    if ((wVar5 & 1) == 0) {
      iVar2 = Acb_ObjFanoutNum(p,iObj);
      bVar1 = 0 < iVar2;
    }
    if (!bVar1) break;
    iVar2 = Acb_ObjFanin(p,iObj,0);
    iVar3 = Acb_ObjFanout(p,iObj,0);
    iVar4 = Acb_ObjIsCo(p,iVar3);
    if (iVar4 == 0) {
      __assert_fail("Acb_ObjIsCo(p, iFanout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                    ,0xf3,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
    }
    Acb_ObjPatchFanin(p,iVar3,iObj,iVar2);
  }
  iVar2 = Acb_ObjFanoutNum(p,iObj);
  if (iVar2 == 0) {
    Acb_ObjRemoveFaninFanout(p,iObj);
    Acb_ObjRemoveFanins(p,iObj);
    Acb_ObjCleanType(p,iObj);
  }
  return;
}

Assistant:

void Acb_ObjRemoveBufInv( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 1 );
    assert( uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0] );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
        if ( uTruth & 1 ) // inv
        {
            word uTruthF = Acb_ObjTruth( p, iFanout );
            Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6Flip(uTruthF, iObjIndex) );
        }
        Acb_ObjRemoveDupFanins( p, iFanout );
    }
    while ( (uTruth & 1) == 0 && Acb_ObjFanoutNum(p, iObj) > 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        assert( Acb_ObjIsCo(p, iFanout) );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
    {
        Acb_ObjRemoveFaninFanout( p, iObj );
        Acb_ObjRemoveFanins( p, iObj );
        Acb_ObjCleanType( p, iObj );
    }
}